

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O2

t_float * value_get(t_symbol *s)

{
  t_pd *x;
  
  x = pd_findbyclass(s,vcommon_class);
  if (x == (t_pd *)0x0) {
    x = pd_new(vcommon_class);
    x[1] = (t_pd)0x0;
    pd_bind(x,s);
  }
  *(int *)(x + 1) = *(int *)(x + 1) + 1;
  return (t_float *)((long)x + 0xc);
}

Assistant:

t_float *value_get(t_symbol *s)
{
    t_vcommon *c = (t_vcommon *)pd_findbyclass(s, vcommon_class);
    if (!c)
    {
        c = (t_vcommon *)pd_new(vcommon_class);
        c->c_f = 0;
        c->c_refcount = 0;
        pd_bind(&c->c_pd, s);
    }
    c->c_refcount++;
    return (&c->c_f);
}